

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  float *pfVar1;
  short *psVar2;
  byte *pbVar3;
  ImGuiItemStatusFlags *pIVar4;
  int *piVar5;
  ImRect *pIVar6;
  ImVec2 IVar7;
  ImGuiID IVar8;
  uint uVar9;
  int iVar10;
  ImGuiWindow *pIVar11;
  ImGuiWindow *pIVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  uint uVar16;
  ImGuiContext *g;
  ImGuiNavItemData *result;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pIVar13 = GImGui;
  pIVar11 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar7 = bb->Max;
  (pIVar13->LastItemData).Rect.Min = bb->Min;
  (pIVar13->LastItemData).Rect.Max = IVar7;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  IVar7 = nav_bb_arg->Max;
  (pIVar13->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar13->LastItemData).NavRect.Max = IVar7;
  uVar16 = extra_flags | pIVar13->CurrentItemFlags;
  (pIVar13->LastItemData).InFlags = uVar16;
  (pIVar13->LastItemData).StatusFlags = 0;
  if (id != 0) {
    if (pIVar13->ActiveId == id) {
      pIVar13->ActiveIdIsAlive = id;
    }
    if (pIVar13->ActiveIdPreviousFrame == id) {
      pIVar13->ActiveIdPreviousFrameIsAlive = true;
    }
    if (((uVar16 & 8) == 0) &&
       ((((psVar2 = &(pIVar11->DC).NavLayersActiveMaskNext,
          *psVar2 = *psVar2 | (ushort)(1 << ((char)(pIVar11->DC).NavLayerCurrent & 0x1f)),
          pIVar13->NavId == id || (pIVar13->NavAnyRequest == true)) &&
         (pIVar12 = pIVar13->NavWindow, pIVar12->RootWindowForNav == pIVar11->RootWindowForNav)) &&
        ((pIVar11 == pIVar12 || (((uint)(pIVar12->Flags | pIVar11->Flags) >> 0x17 & 1) != 0)))))) {
      pIVar12 = pIVar13->CurrentWindow;
      IVar8 = (pIVar13->LastItemData).ID;
      IVar7 = (pIVar13->LastItemData).NavRect.Min;
      fVar20 = IVar7.x;
      fVar21 = IVar7.y;
      IVar7 = (pIVar13->LastItemData).NavRect.Max;
      fVar22 = IVar7.x;
      fVar23 = IVar7.y;
      uVar16 = (pIVar13->LastItemData).InFlags;
      if ((pIVar13->NavInitRequest == true) &&
         ((uVar16 & 4) == 0 && pIVar13->NavLayer == (pIVar12->DC).NavLayerCurrent)) {
        if (((uVar16 & 0x10) == 0) || (pIVar13->NavInitResultId == 0)) {
          pIVar13->NavInitResultId = IVar8;
          IVar7 = (pIVar12->DC).CursorStartPos;
          fVar17 = IVar7.x;
          fVar18 = IVar7.y;
          (pIVar13->NavInitResultRectRel).Min.x = fVar20 - fVar17;
          (pIVar13->NavInitResultRectRel).Min.y = fVar21 - fVar18;
          (pIVar13->NavInitResultRectRel).Max.x = fVar22 - fVar17;
          (pIVar13->NavInitResultRectRel).Max.y = fVar23 - fVar18;
        }
        if ((uVar16 & 0x10) == 0) {
          pIVar13->NavInitRequest = false;
          pIVar13->NavAnyRequest = pIVar13->NavMoveScoringItems;
        }
      }
      if (pIVar13->NavMoveScoringItems == true) {
        uVar9 = pIVar13->NavMoveFlags;
        if ((uVar9 >> 10 & 1) == 0) {
          if ((uVar16 & 4) == 0 && ((uVar9 & 0x10) != 0 || pIVar13->NavId != IVar8)) {
            result = &pIVar13->NavMoveResultOther;
            if (pIVar12 == pIVar13->NavWindow) {
              result = &pIVar13->NavMoveResultLocal;
            }
            bVar14 = NavScoreItem(result);
            if (bVar14) {
              NavApplyItemToResult(result);
            }
            if (((((pIVar13->NavMoveFlags & 0x20) != 0) &&
                 (fVar17 = (pIVar12->ClipRect).Max.y, fVar21 < fVar17)) &&
                (fVar18 = (pIVar12->ClipRect).Min.y, fVar18 < fVar23)) &&
               ((fVar20 < (pIVar12->ClipRect).Max.x &&
                ((pIVar12->ClipRect).Min.x <= fVar22 && fVar22 != (pIVar12->ClipRect).Min.x)))) {
              fVar19 = fVar17;
              if (fVar23 <= fVar17) {
                fVar19 = fVar23;
              }
              if (fVar21 <= fVar17) {
                fVar17 = fVar21;
              }
              if ((fVar23 - fVar21) * 0.7 <=
                  (float)(-(uint)(fVar23 < fVar18) & (uint)fVar18 |
                         ~-(uint)(fVar23 < fVar18) & (uint)fVar19) -
                  (float)(-(uint)(fVar21 < fVar18) & (uint)fVar18 |
                         ~-(uint)(fVar21 < fVar18) & (uint)fVar17)) {
                bVar14 = NavScoreItem(&pIVar13->NavMoveResultLocalVisible);
                if (bVar14) {
                  NavApplyItemToResult(&pIVar13->NavMoveResultLocalVisible);
                }
              }
            }
          }
        }
        else if ((uVar16 & 0x405) == 0x400 || (uVar9 >> 9 & 1) != 0) {
          iVar10 = pIVar13->NavTabbingDir;
          if (iVar10 == -1) {
            if (pIVar13->NavId == IVar8) {
              if ((pIVar13->NavMoveResultLocal).ID != 0) {
                pIVar13->NavMoveScoringItems = false;
                pIVar13->NavAnyRequest = pIVar13->NavInitRequest;
              }
            }
            else {
              NavApplyItemToResult(&pIVar13->NavMoveResultLocal);
            }
          }
          else if (iVar10 == 0) {
            if ((pIVar13->NavTabbingResultFirst).ID == 0) {
              pIVar13->NavMoveScoringItems = false;
              NavApplyItemToResult(&pIVar13->NavTabbingResultFirst);
              bVar14 = true;
              if (GImGui->NavMoveScoringItems == false) {
                bVar14 = GImGui->NavInitRequest;
              }
              GImGui->NavAnyRequest = bVar14;
            }
          }
          else if (iVar10 == 1) {
            if ((pIVar13->NavTabbingResultFirst).ID == 0) {
              NavApplyItemToResult(&pIVar13->NavTabbingResultFirst);
            }
            piVar5 = &pIVar13->NavTabbingCounter;
            *piVar5 = *piVar5 + -1;
            if (*piVar5 == 0) {
              GImGui->NavMoveScoringItems = false;
              NavApplyItemToResult(&pIVar13->NavMoveResultLocal);
              bVar14 = true;
              if (GImGui->NavMoveScoringItems == false) {
                bVar14 = GImGui->NavInitRequest;
              }
              GImGui->NavAnyRequest = bVar14;
            }
            else if (pIVar13->NavId == IVar8) {
              pIVar13->NavTabbingCounter = 1;
            }
          }
        }
      }
      if (pIVar13->NavId == IVar8) {
        if (pIVar13->NavWindow != pIVar12) {
          SetNavWindow(pIVar12);
        }
        pIVar13->NavLayer = (pIVar12->DC).NavLayerCurrent;
        pIVar13->NavFocusScopeId = pIVar13->CurrentFocusScopeId;
        pIVar13->NavIdIsAlive = true;
        IVar7 = (pIVar12->DC).CursorStartPos;
        fVar17 = IVar7.x;
        fVar18 = IVar7.y;
        pIVar6 = pIVar12->NavRectRel + (pIVar12->DC).NavLayerCurrent;
        (pIVar6->Min).x = fVar20 - fVar17;
        (pIVar6->Min).y = fVar21 - fVar18;
        (pIVar6->Max).x = fVar22 - fVar17;
        (pIVar6->Max).y = fVar23 - fVar18;
      }
    }
  }
  (pIVar13->NextItemData).Flags = 0;
  fVar20 = (bb->Max).y;
  pfVar1 = &(pIVar11->ClipRect).Min.y;
  if (((fVar20 < *pfVar1 || fVar20 == *pfVar1) ||
      (fVar20 = (pIVar11->ClipRect).Max.y, pfVar1 = &(bb->Min).y,
      fVar20 < *pfVar1 || fVar20 == *pfVar1)) ||
     (fVar20 = (bb->Max).x,
     fVar20 < (pIVar11->ClipRect).Min.x || fVar20 == (pIVar11->ClipRect).Min.x)) {
    bVar14 = false;
  }
  else {
    fVar20 = (pIVar11->ClipRect).Max.x;
    bVar14 = (bb->Min).x <= fVar20 && fVar20 != (bb->Min).x;
  }
  if ((bVar14) ||
     (((id != 0 && ((pIVar13->ActiveId == id || (pIVar13->NavId == id)))) ||
      (pIVar13->LogEnabled == true)))) {
    if ((id != 0) && (pIVar13->DebugLocateId == id)) {
      DebugLocateItemResolveWithLastItem();
    }
    if (bVar14) {
      pbVar3 = (byte *)((long)&(pIVar13->LastItemData).StatusFlags + 1);
      *pbVar3 = *pbVar3 | 2;
    }
    bVar14 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    bVar15 = true;
    if (bVar14) {
      pIVar4 = &(pIVar13->LastItemData).StatusFlags;
      *(byte *)pIVar4 = (byte)*pIVar4 | 1;
    }
  }
  else {
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        KeepAliveID(id);

        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        if (!(g.LastItemData.InFlags & ImGuiItemFlags_NoNav))
        {
            window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
            if (g.NavId == id || g.NavAnyRequest)
                if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                    if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                        NavProcessItem();
        }

        // [DEBUG] People keep stumbling on this problem and using "" as identifier in the root of a window instead of "##something".
        // Empty identifier are valid and useful in a small amount of cases, but 99.9% of the time you want to use "##something".
        // READ THE FAQ: https://dearimgui.org/faq
        IM_ASSERT(id != window->ID && "Cannot have an empty ID at the root of a window. If you need an empty label, use ## and read the FAQ about how the ID Stack works!");
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    // (FIXME: This is a modified copy of IsClippedEx() so we can reuse the is_rect_visible value)
    //const bool is_clipped = IsClippedEx(bb, id);
    //if (is_clipped)
    //    return false;
    const bool is_rect_visible = bb.Overlaps(window->ClipRect);
    if (!is_rect_visible)
        if (id == 0 || (id != g.ActiveId && id != g.NavId))
            if (!g.LogEnabled)
                return false;

    // [DEBUG]
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (id != 0 && id == g.DebugLocateId)
        DebugLocateItemResolveWithLastItem();
#endif
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (is_rect_visible)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Visible;
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}